

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_iso9660_filename.c
# Opt level: O1

int create_iso_image(uchar *buff,size_t buffsize,size_t *used,char *opt)

{
  int iVar1;
  int iVar2;
  archive *_a;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  char sym1 [2];
  char fname1 [256];
  char fname2 [256];
  char sym128 [129];
  char sym255 [256];
  char local_3ca [2];
  undefined4 local_3c8;
  undefined2 auStack_3c4 [126];
  char local_2c8 [256];
  char local_1c8 [144];
  char local_138 [254];
  undefined2 local_3a;
  
  _a = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Û',(uint)(_a != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_write_set_format_iso9660(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ü',(uint)(iVar1 == 0),"0 == archive_write_set_format_iso9660(a)",_a);
  iVar1 = archive_write_add_filter_none(_a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Ý',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",_a);
  iVar1 = archive_write_set_option(_a,(char *)0x0,"pad",(char *)0x0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'Þ',(uint)(iVar1 == 0),"0 == archive_write_set_option(a, NULL, \"pad\", NULL)"
                   ,_a);
  if (used != (size_t *)0x0) {
    iVar1 = archive_write_set_options(_a,(char *)used);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                     ,L'à',(uint)(iVar1 == 0),"0 == archive_write_set_options(a, opt)",_a);
  }
  iVar1 = archive_write_set_bytes_per_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'á',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 1)",_a);
  iVar1 = archive_write_set_bytes_in_last_block(_a,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'â',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_in_last_block(a, 1)",_a);
  iVar1 = archive_write_open_memory(_a,buff,0x3c000,(size_t *)buffsize);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                   ,L'ã',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, used)",_a);
  local_3ca[0] = 'x';
  local_3ca[1] = '\0';
  builtin_strncpy(local_1c8,
                  "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaax"
                  ,0x81);
  memset(local_138,0x61,0xfe);
  local_3a = 0x78;
  lVar5 = 0;
  iVar1 = 0;
  do {
    uVar4 = (ulong)*(int *)((long)&DAT_002607f0 + lVar5);
    if ((long)uVar4 < 1) {
      uVar4 = 0;
    }
    else {
      memset(&local_3c8,0x61,uVar4);
      memset(local_2c8,0x41,uVar4);
    }
    uVar3 = (uint)uVar4;
    uVar4 = uVar4 & 0xffffffff;
    if (uVar3 != 0) {
      *(undefined1 *)((long)&local_3c8 + uVar4) = 0;
      local_2c8[uVar4] = '\0';
      add_entry(_a,(char *)&local_3c8,(char *)0x0);
      add_entry(_a,local_2c8,local_3ca);
      iVar1 = iVar1 + 2;
    }
    if (uVar3 < 0xfe) {
      *(undefined2 *)((long)&local_3c8 + uVar4) = 0x632e;
      *(undefined1 *)((long)&local_3c8 + uVar4 + 2) = 0;
      (local_2c8 + uVar4)[0] = '.';
      (local_2c8 + uVar4)[1] = 'C';
      local_2c8[uVar4 + 2] = '\0';
      add_entry(_a,(char *)&local_3c8,local_1c8);
      add_entry(_a,local_2c8,local_138);
      iVar1 = iVar1 + 2;
    }
    if (uVar3 < 0xfc) {
      *(undefined4 *)((long)&local_3c8 + uVar4) = 0x676e702e;
      *(undefined1 *)((long)auStack_3c4 + uVar4) = 0;
      builtin_strncpy(local_2c8 + uVar4,".PNG",5);
      add_entry(_a,(char *)&local_3c8,(char *)0x0);
      add_entry(_a,local_2c8,local_3ca);
      iVar1 = iVar1 + 2;
    }
    if (uVar3 < 0xfb) {
      *(undefined4 *)((long)&local_3c8 + uVar4) = 0x65706a2e;
      *(undefined2 *)((long)auStack_3c4 + uVar4) = 0x67;
      builtin_strncpy(local_2c8 + uVar4,".JPEG",6);
      add_entry(_a,(char *)&local_3c8,local_1c8);
      add_entry(_a,local_2c8,local_138);
      iVar1 = iVar1 + 2;
    }
    lVar5 = lVar5 + 4;
  } while (lVar5 != 0x80);
  iVar2 = archive_write_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'ī',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",_a);
  iVar2 = archive_write_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_format_iso9660_filename.c"
                      ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",_a);
  return iVar1;
}

Assistant:

static int
create_iso_image(unsigned char *buff, size_t buffsize, size_t *used,
    const char *opt)
{
	struct archive *a;
	int i, l, fcnt;
	const int lens[] = {
	    0, 1, 3, 5, 7, 8, 9, 29, 30, 31, 32,
		62, 63, 64, 65, 101, 102, 103, 104,
	    191, 192, 193, 194, 204, 205, 206, 207, 208,
		252, 253, 254, 255,
	    -1 };
	char fname1[256];
	char fname2[256];
	char sym1[2];
	char sym128[129];
	char sym255[256];

	/* ISO9660 format: Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == archive_write_set_format_iso9660(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_set_option(a, NULL, "pad", NULL));
	if (opt)
		assertA(0 == archive_write_set_options(a, opt));
	assertA(0 == archive_write_set_bytes_per_block(a, 1));
	assertA(0 == archive_write_set_bytes_in_last_block(a, 1));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, used));

	sym1[0] = 'x';
	sym1[1] = '\0';
	for (i = 0; i < (int)sizeof(sym128)-2; i++)
		sym128[i] = 'a';
	sym128[sizeof(sym128)-2] = 'x';
	sym128[sizeof(sym128)-1] = '\0';
	for (i = 0; i < (int)sizeof(sym255)-2; i++)
		sym255[i] = 'a';
	sym255[sizeof(sym255)-2] = 'x';
	sym255[sizeof(sym255)-1] = '\0';

	fcnt = 0;
	for (i = 0; lens[i] >= 0; i++) {
		for (l = 0; l < lens[i]; l++) {
			fname1[l] = 'a';
			fname2[l] = 'A';
		}
		if (l > 0) {
			fname1[l] = '\0';
			fname2[l] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 254) {
			fname1[l] = '.';
			fname1[l+1] = 'c';
			fname1[l+2] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'C';
			fname2[l+2] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
		if (l < 252) {
			fname1[l] = '.';
			fname1[l+1] = 'p';
			fname1[l+2] = 'n';
			fname1[l+3] = 'g';
			fname1[l+4] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'P';
			fname2[l+2] = 'N';
			fname2[l+3] = 'G';
			fname2[l+4] = '\0';
			add_entry(a, fname1, NULL);
			add_entry(a, fname2, sym1);
			fcnt += 2;
		}
		if (l < 251) {
			fname1[l] = '.';
			fname1[l+1] = 'j';
			fname1[l+2] = 'p';
			fname1[l+3] = 'e';
			fname1[l+4] = 'g';
			fname1[l+5] = '\0';
			fname2[l] = '.';
			fname2[l+1] = 'J';
			fname2[l+2] = 'P';
			fname2[l+3] = 'E';
			fname2[l+4] = 'G';
			fname2[l+5] = '\0';
			add_entry(a, fname1, sym128);
			add_entry(a, fname2, sym255);
			fcnt += 2;
		}
	}

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_free(a));

	return (fcnt);
}